

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O3

R_conflict1 scanPrefix(char *p,char *stop,int base)

{
  byte bVar1;
  uint uVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  bool bVar4;
  R_conflict1 RVar5;
  R_conflict1 RVar6;
  
  uVar3 = CONCAT44(in_register_00000014,base);
  if ((stop <= p) || (9 < (int)*p - 0x30U)) goto LAB_0012139c;
  if (*p == '0') {
    if (p + 1 < stop) {
      bVar1 = p[1];
      if (bVar1 < 0x62) {
        if (bVar1 == 0x42) {
LAB_00121381:
          uVar3 = (ulong)(uint)base;
          if (base == 0) {
            uVar3 = 2;
          }
          bVar4 = (int)uVar3 == 2;
          goto LAB_001213ac;
        }
        if (bVar1 == 0x58) goto LAB_0012139d;
      }
      else {
        if (bVar1 == 0x78) {
LAB_0012139d:
          uVar3 = (ulong)(uint)base;
          if (base == 0) {
            uVar3 = 0x10;
          }
          bVar4 = (int)uVar3 == 0x10;
LAB_001213ac:
          RVar6._8_8_ = uVar3;
          RVar6.next = p + (ulong)bVar4 * 2;
          return RVar6;
        }
        if (bVar1 == 0x62) goto LAB_00121381;
      }
    }
    uVar2 = 8;
  }
  else {
    uVar2 = 10;
  }
  uVar3 = (ulong)(uint)base;
  if (base == 0) {
    uVar3 = (ulong)uVar2;
  }
LAB_0012139c:
  RVar5._8_8_ = uVar3;
  RVar5.next = p;
  return RVar5;
}

Assistant:

static auto scanPrefix(const char *p, const char *stop, int base)
{
    struct R
    {
        const char *next;
        int base;
    };
    if (p < stop && isAsciiDigit(*p)) {
        if (*p == '0') {
            const char *x_or_b = p + 1;
            if (x_or_b < stop) {
                switch (*x_or_b) {
                case 'b':
                case 'B':
                    if (base == 0)
                        base = 2;
                    if (base == 2)
                        p += 2;
                    return R{p, base};
                case 'x':
                case 'X':
                    if (base == 0)
                        base = 16;
                    if (base == 16)
                        p += 2;
                    return R{p, base};
                }
            }
            if (base == 0)
                base = 8;
        } else if (base == 0) {
            base = 10;
        }
        Q_ASSERT(base);
    }
    return R{p, base};
}